

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O3

int nni_posix_resolv_sysinit(nng_init_params *params)

{
  int iVar1;
  ushort uVar2;
  long lVar3;
  void *arg;
  long lVar4;
  
  nni_mtx_init(&resolv_mtx);
  nni_cv_init(&resolv_cv,&resolv_mtx);
  resolv_fini = 0;
  nni_aio_list_init(&resolv_aios);
  uVar2 = 1;
  if (1 < params->num_resolver_threads) {
    uVar2 = params->num_resolver_threads;
  }
  resolv_num_thr = uVar2;
  params->num_resolver_threads = uVar2;
  resolv_thrs = (nni_thr *)nni_zalloc((ulong)uVar2 * 0x98);
  resolv_active = (nni_aio **)nni_zalloc((long)resolv_num_thr << 3);
  iVar1 = 2;
  if (resolv_active == (nni_aio **)0x0 || resolv_thrs == (nni_thr *)0x0) {
LAB_00119b50:
    nni_posix_resolv_sysfini();
  }
  else {
    if (0 < resolv_num_thr) {
      lVar3 = 0;
      arg = (void *)0x0;
      do {
        iVar1 = nni_thr_init((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar3),resolv_worker,arg);
        if (iVar1 != 0) goto LAB_00119b50;
        arg = (void *)((long)arg + 1);
        lVar3 = lVar3 + 0x98;
      } while ((long)arg < (long)resolv_num_thr);
      if (0 < resolv_num_thr) {
        lVar3 = 0;
        lVar4 = 0;
        do {
          nni_thr_run((nni_thr *)((long)&(resolv_thrs->thr).tid + lVar3));
          lVar4 = lVar4 + 1;
          lVar3 = lVar3 + 0x98;
        } while (lVar4 < resolv_num_thr);
        return 0;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_posix_resolv_sysinit(nng_init_params *params)
{
	nni_mtx_init(&resolv_mtx);
	nni_cv_init(&resolv_cv, &resolv_mtx);
	resolv_fini = false;
	nni_aio_list_init(&resolv_aios);

	resolv_num_thr = params->num_resolver_threads;
	if (resolv_num_thr < 1) {
		resolv_num_thr = 1;
	}
	params->num_resolver_threads = resolv_num_thr;
	// no limit on the maximum for now
	resolv_thrs   = NNI_ALLOC_STRUCTS(resolv_thrs, resolv_num_thr);
	resolv_active = nni_zalloc(sizeof(nni_aio *) * resolv_num_thr);
	if (resolv_thrs == NULL || resolv_active == NULL) {
		nni_posix_resolv_sysfini();
		return (NNG_ENOMEM);
	}

	for (int i = 0; i < resolv_num_thr; i++) {
		int rv = nni_thr_init(
		    &resolv_thrs[i], resolv_worker, (void *) (intptr_t) i);
		if (rv != 0) {
			nni_posix_resolv_sysfini();
			return (rv);
		}
	}
	for (int i = 0; i < resolv_num_thr; i++) {
		nni_thr_run(&resolv_thrs[i]);
	}

	return (0);
}